

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.hpp
# Opt level: O1

string * __thiscall
beast::unit_test::detail::reporter<void>::fmtdur_abi_cxx11_
          (string *__return_storage_ptr__,reporter<void> *this,duration *d)

{
  char *pcVar1;
  _func_int **pp_Var2;
  type tVar3;
  long lVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  char *tmp_finish;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  stringstream ss;
  undefined1 *local_1e8;
  char *local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_1c8;
  stringstream local_1b0 [2];
  undefined1 local_1ae [14];
  long local_1a0;
  undefined8 local_198 [2];
  undefined4 uStack_188;
  char *local_180;
  char *local_178;
  ios_base local_130 [264];
  
  pp_Var2 = (this->super_runner)._vptr_runner;
  tVar3 = (long)pp_Var2 / 1000000;
  if ((long)pp_Var2 < 1000000000) {
    local_1e0 = (char *)0x0;
    local_1d8 = 0;
    local_180 = local_1ae;
    pcVar1 = (char *)((long)&uStack_188 + 1);
    local_1c8.m_value = -tVar3;
    if (0 < (long)tVar3) {
      local_1c8.m_value = tVar3;
    }
    local_1c8.m_czero = '0';
    local_1c8.m_zero = 0x30;
    local_1e8 = &local_1d8;
    local_1c8.m_finish = pcVar1;
    local_178 = pcVar1;
    local_180 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::
                convert(&local_1c8);
    if ((long)pp_Var2 < -999999) {
      local_180[-1] = '-';
      local_180 = local_180 + -1;
    }
    local_178 = pcVar1;
    ::std::__cxx11::string::replace((ulong)&local_1e8,0,local_1e0,(ulong)local_180);
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1e8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar4 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
    }
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b0);
    *(uint *)((long)&uStack_188 + *(long *)(local_1a0 + -0x18)) =
         *(uint *)((long)&uStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 1;
    poVar6 = ::std::ostream::_M_insert<double>((double)(long)tVar3 / 1000.0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b0);
    ::std::ios_base::~ios_base(local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
reporter<_>::fmtdur(typename clock_type::duration const& d)
{
    using namespace std::chrono;
    auto const ms = duration_cast<milliseconds>(d);
    if(ms < seconds{1})
        return boost::lexical_cast<std::string>(
            ms.count()) + "ms";
    std::stringstream ss;
    ss << std::fixed << std::setprecision(1) <<
       (ms.count()/1000.) << "s";
    return ss.str();
}